

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::MergeSort<unsigned_int>
               (uint *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  ulong uVar2;
  uint local_b4;
  uint local_a0;
  uint local_9c;
  uint leftElement;
  uint rightElement;
  uint32 doubleLength;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 right;
  uint32 mid;
  uint32 left;
  uint32 position;
  uint32 lastSize;
  uint32 bucketSize;
  undefined8 local_68;
  TrackAllocData local_60;
  uint *local_38;
  uint *buffer;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  ArenaAllocator *allocator_local;
  CompareVarsInfo *cvInfo_local;
  uint *puStack_10;
  uint32 length_local;
  uint *list_local;
  
  buffer = (uint *)cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)allocator;
  allocator_local = (ArenaAllocator *)cvInfo;
  cvInfo_local._4_4_ = length;
  puStack_10 = list;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&unsigned_int::typeinfo,0,(ulong)length,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
             ,0x1aa1);
  this = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                   (&allocator->
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                    &local_60);
  _lastSize = Memory::ArenaAllocator::Alloc;
  local_68 = 0;
  local_38 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                       ((Memory *)this,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)cvInfo_local._4_4_);
  position = 2;
  left = 1;
  j = 0;
  k = 0;
  doubleLength = 0;
  rightElement = 0;
  leftElement = cvInfo_local._4_4_ * 2;
  do {
    mid = 0;
    if (leftElement <= position) {
      return;
    }
    for (; mid < cvInfo_local._4_4_; mid = position + mid) {
      right = mid;
      i = mid + left;
      if ((i < cvInfo_local._4_4_) &&
         (uVar2 = (*(code *)buffer)(allocator_local,puStack_10 + i,puStack_10 + (i - 1)),
         (uVar2 & 1) != 0)) {
        local_b4 = mid + position;
        if (cvInfo_local._4_4_ <= local_b4) {
          local_b4 = cvInfo_local._4_4_;
        }
        j = local_b4;
        k = i - 1;
        doubleLength = 0;
        rightElement = i;
        while (rightElement < local_b4) {
          local_38[doubleLength] = puStack_10[rightElement];
          rightElement = rightElement + 1;
          doubleLength = doubleLength + 1;
        }
        doubleLength = doubleLength - 1;
        local_9c = local_38[doubleLength];
        local_a0 = puStack_10[k];
LAB_0110ce3c:
        uVar2 = (*(code *)buffer)(allocator_local,&local_9c,&local_a0);
        if ((uVar2 & 1) == 0) {
          puStack_10[rightElement - 1] = local_9c;
          uVar1 = rightElement - 1;
          if (doubleLength == 0) goto LAB_0110cf17;
          doubleLength = doubleLength - 1;
          local_9c = local_38[doubleLength];
LAB_0110cf10:
          rightElement = rightElement - 1;
          goto LAB_0110ce3c;
        }
        puStack_10[rightElement - 1] = local_a0;
        if (right < k) {
          k = k - 1;
          local_a0 = puStack_10[k];
          goto LAB_0110cf10;
        }
        puStack_10[rightElement - 2] = local_9c;
        uVar1 = rightElement - 2;
LAB_0110cf17:
        while (rightElement = uVar1, doubleLength != 0) {
          doubleLength = doubleLength - 1;
          puStack_10[rightElement - 1] = local_38[doubleLength];
          uVar1 = rightElement - 1;
        }
      }
    }
    left = position;
    position = position << 1;
  } while( true );
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }